

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

void google::protobuf::internal::TcParser::WriteMapEntryAsUnknown
               (MessageLite *msg,TcParseTableBase *table,uint32_t tag,NodeBase *node,
               MapAuxInfo map_info)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  string *psVar4;
  UnknownFieldOps *pUVar5;
  int line;
  string_view sVar6;
  MapTypeCard local_b9;
  LogMessageFatal local_b8 [16];
  string serialized;
  CodedOutputStream coded_output;
  StringOutputStream string_output;
  
  serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
  serialized._M_string_length = 0;
  serialized.field_2._M_local_buf[0] = '\0';
  io::StringOutputStream::StringOutputStream(&string_output,&serialized);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            (&coded_output,&string_output);
  local_b9 = map_info.key_type_card.data_;
  line = 0x9bc;
  switch(local_b9.data_ & 7) {
  case 0:
    uVar1 = ((ulong)map_info & 0xffffffff) >> 3;
    bVar2 = (byte)uVar1 & 7;
    if (bVar2 == 2) {
      bVar3 = MapTypeCard::is_zigzag(&local_b9);
      if (bVar3) {
        WireFormatLite::WriteSInt64(1,(int64_t)node[1].next,&coded_output);
      }
      else {
        bVar3 = MapTypeCard::is_signed(&local_b9);
        if (bVar3) {
          WireFormatLite::WriteInt64(1,(int64_t)node[1].next,&coded_output);
        }
        else {
          WireFormatLite::WriteUInt64(1,(uint64_t)node[1].next,&coded_output);
        }
      }
    }
    else if (bVar2 == 1) {
      bVar3 = MapTypeCard::is_zigzag(&local_b9);
      if (bVar3) {
        WireFormatLite::WriteSInt32(1,*(int32_t *)&node[1].next,&coded_output);
      }
      else {
        bVar3 = MapTypeCard::is_signed(&local_b9);
        if (bVar3) {
          WireFormatLite::WriteInt32(1,*(uint32_t *)&node[1].next,&coded_output);
        }
        else {
          WireFormatLite::WriteUInt32(1,*(uint32_t *)&node[1].next,&coded_output);
        }
      }
    }
    else {
      if ((uVar1 & 7) != 0) {
        line = 0x9a9;
        goto switchD_0014c567_caseD_3;
      }
      WireFormatLite::WriteBool(1,(bool)(*(byte *)&node[1].next & 1),&coded_output);
    }
    break;
  case 1:
    WireFormatLite::WriteFixed64(1,(uint64_t)node[1].next,&coded_output);
    break;
  case 2:
    psVar4 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                       ((uint)((byte)(((ulong)map_info & 0xffffffff) >> 3) & 7),3,
                        "+type_card.cpp_type() == +MapTypeCard::kString");
    if (psVar4 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x9b6,psVar4->_M_string_length,(psVar4->_M_dataplus)._M_p);
      goto LAB_0014c740;
    }
    WireFormatLite::WriteString(1,(string *)(node + 1),&coded_output);
    break;
  default:
switchD_0014c567_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                ,line);
  case 5:
    WireFormatLite::WriteFixed32(1,*(uint32_t *)&node[1].next,&coded_output);
  }
  if ((map_info._0_4_ >> 0x14 & 1) != 0) {
    WireFormatLite::WriteInt32
              (2,*(int32_t *)((long)&node->next + ((ulong)map_info >> 0x20 & 0xffff)),&coded_output)
    ;
    io::CodedOutputStream::~CodedOutputStream(&coded_output);
    pUVar5 = GetUnknownFieldOps(table);
    sVar6._M_str = serialized._M_dataplus._M_p;
    sVar6._M_len = serialized._M_string_length;
    (*pUVar5->write_length_delimited)(msg,tag >> 3,sVar6);
    std::__cxx11::string::~string((string *)&serialized);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0x9ca,0x20,"map_info.value_is_validated_enum");
LAB_0014c740:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b8);
}

Assistant:

void TcParser::WriteMapEntryAsUnknown(MessageLite* msg,
                                      const TcParseTableBase* table,
                                      uint32_t tag, NodeBase* node,
                                      MapAuxInfo map_info) {
  std::string serialized;
  {
    io::StringOutputStream string_output(&serialized);
    io::CodedOutputStream coded_output(&string_output);
    SerializeMapKey(node, map_info.key_type_card, coded_output);
    // The mapped_type is always an enum here.
    ABSL_DCHECK(map_info.value_is_validated_enum);
    WireFormatLite::WriteInt32(2,
                               *reinterpret_cast<int32_t*>(
                                   node->GetVoidValue(map_info.node_size_info)),
                               &coded_output);
  }
  GetUnknownFieldOps(table).write_length_delimited(msg, tag >> 3, serialized);
}